

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationZZ.hpp
# Opt level: O1

SquareMatrix<std::complex<float>_> __thiscall
qclab::qgates::RotationZZ<std::complex<float>_>::matrix(RotationZZ<std::complex<float>_> *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong *puVar3;
  data_type extraout_RDX;
  long in_RSI;
  SquareMatrix<std::complex<float>_> SVar4;
  
  uVar2 = *(ulong *)(in_RSI + 0x14);
  uVar1 = *(ulong *)(in_RSI + 0x14);
  (this->super_QRotationGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
  super_QObject<std::complex<float>_>._vptr_QObject = (_func_int **)0x4;
  puVar3 = (ulong *)operator_new__(0x80);
  *puVar3 = 0;
  puVar3[1] = 0;
  puVar3[2] = 0;
  puVar3[3] = 0;
  puVar3[4] = 0;
  puVar3[5] = 0;
  puVar3[6] = 0;
  puVar3[7] = 0;
  puVar3[8] = 0;
  puVar3[9] = 0;
  puVar3[10] = 0;
  puVar3[0xb] = 0;
  puVar3[0xc] = 0;
  puVar3[0xd] = 0;
  puVar3[0xe] = 0;
  puVar3[0xf] = 0;
  *(ulong **)&(this->super_QRotationGate2<std::complex<float>_>).super_QAdjustable = puVar3;
  uVar2 = uVar2 ^ 0x8000000000000000;
  *puVar3 = uVar2;
  puVar3[1] = 0;
  puVar3[2] = 0;
  puVar3[3] = 0;
  puVar3[4] = 0;
  puVar3[5] = uVar1;
  puVar3[6] = 0;
  puVar3[7] = 0;
  puVar3[8] = 0;
  puVar3[9] = 0;
  puVar3[10] = uVar1;
  puVar3[0xb] = 0;
  puVar3[0xc] = 0;
  puVar3[0xd] = 0;
  puVar3[0xe] = 0;
  puVar3[0xf] = uVar2;
  SVar4.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  SVar4.size_ = (size_type_conflict)this;
  return SVar4;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          const T a = T(this->cos(),-this->sin()) ;
          const T b = T(this->cos(), this->sin()) ;
          return qclab::dense::SquareMatrix< T >( a , 0 , 0 , 0 ,
                                                  0 , b , 0 , 0 ,
                                                  0 , 0 , b , 0 ,
                                                  0 , 0 , 0 , a ) ;
        }